

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutEdgeRef(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  uint uVar2;
  If_Obj_t *pIVar3;
  ulong uVar4;
  float fVar5;
  float local_1c;
  
  uVar2 = *(uint *)&pCut->field_0x1c;
  local_1c = (float)(uVar2 >> 0x18);
  uVar4 = 0;
  while( true ) {
    if (uVar2 >> 0x18 <= uVar4) {
      return local_1c;
    }
    pIVar3 = If_ManObj(p,(int)(&pCut[1].Area)[uVar4]);
    if (pIVar3 == (If_Obj_t *)0x0) break;
    iVar1 = pIVar3->nRefs;
    if (iVar1 < 0) {
      __assert_fail("pLeaf->nRefs >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                    ,0x4a0,"float If_CutEdgeRef(If_Man_t *, If_Cut_t *)");
    }
    pIVar3->nRefs = iVar1 + 1;
    if ((iVar1 == 0) &&
       (((undefined1  [112])*pIVar3 & (undefined1  [112])0xf) == (undefined1  [112])0x4)) {
      fVar5 = If_CutEdgeRef(p,&pIVar3->CutBest);
      local_1c = local_1c + fVar5;
    }
    uVar4 = uVar4 + 1;
    uVar2 = *(uint *)&pCut->field_0x1c;
  }
  return local_1c;
}

Assistant:

float If_CutEdgeRef( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Edge;
    int i;
    Edge = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->nRefs >= 0 );
        if ( pLeaf->nRefs++ > 0 || !If_ObjIsAnd(pLeaf) )
            continue;
        Edge += If_CutEdgeRef( p, If_ObjCutBest(pLeaf) );
    }
    return Edge;
}